

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_op_tags.hpp
# Opt level: O2

string * __thiscall
viennamath::op_partial_deriv<double>::str_abi_cxx11_
          (string *__return_storage_ptr__,op_partial_deriv<double> *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"partial_deriv<");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,">");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string str() const
      {
        std::stringstream ss;
        ss << "partial_deriv<" << id_ << ">";
        return ss.str();
      }